

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGeneric6DofConstraint.cpp
# Opt level: O3

int __thiscall
btGeneric6DofConstraint::get_limit_motor_info2
          (btGeneric6DofConstraint *this,btRotationalLimitMotor *limot,btTransform *transA,
          btTransform *transB,btVector3 *linVelA,btVector3 *linVelB,btVector3 *angVelA,
          btVector3 *angVelB,btConstraintInfo2 *info,int row,btVector3 *ax1,int rotational,
          int rotAllowed)

{
  undefined8 uVar1;
  undefined8 uVar2;
  bool bVar3;
  int iVar4;
  btScalar *pbVar5;
  btScalar *pbVar6;
  long lVar7;
  int iVar8;
  long lVar9;
  bool bVar10;
  float fVar11;
  float fVar12;
  btScalar bVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  btScalar bVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  undefined1 local_40 [16];
  
  bVar3 = limot->m_enableMotor;
  iVar4 = limot->m_currentLimit;
  iVar8 = 0;
  if ((iVar4 != 0 | bVar3) == 1) {
    lVar9 = (long)(row * info->rowskip);
    bVar10 = rotational != 0;
    pbVar5 = (&info->m_J1linearAxis)[bVar10];
    pbVar6 = (&info->m_J2linearAxis)[bVar10];
    pbVar5[lVar9] = ax1->m_floats[0];
    pbVar5[lVar9 + 1] = ax1->m_floats[1];
    pbVar5[lVar9 + 2] = ax1->m_floats[2];
    pbVar6[lVar9] = -ax1->m_floats[0];
    pbVar6[lVar9 + 1] = -ax1->m_floats[1];
    pbVar6[lVar9 + 2] = -ax1->m_floats[2];
    if (!bVar10) {
      if (this->m_useOffsetForConstraintFrame == true) {
        fVar23 = ax1->m_floats[0];
        fVar11 = limot->m_currentPosition - limot->m_currentLimitError;
        fVar22 = (this->m_calculatedTransformA).m_origin.m_floats[0] -
                 (transA->m_origin).m_floats[0];
        fVar24 = (this->m_calculatedTransformB).m_origin.m_floats[0] -
                 (transB->m_origin).m_floats[0];
        fVar19 = (this->m_calculatedTransformA).m_origin.m_floats[1] -
                 (transA->m_origin).m_floats[1];
        fVar20 = (this->m_calculatedTransformB).m_origin.m_floats[1] -
                 (transB->m_origin).m_floats[1];
        fVar25 = (this->m_calculatedTransformA).m_origin.m_floats[2] -
                 (transA->m_origin).m_floats[2];
        fVar26 = (this->m_calculatedTransformB).m_origin.m_floats[2] -
                 (transB->m_origin).m_floats[2];
        fVar15 = this->m_factA;
        fVar16 = this->m_factB;
        fVar18 = (float)*(undefined8 *)(ax1->m_floats + 1);
        fVar30 = (float)((ulong)*(undefined8 *)(ax1->m_floats + 1) >> 0x20);
        fVar28 = fVar30 * fVar25 + fVar22 * fVar23 + fVar18 * fVar19;
        fVar29 = fVar30 * fVar26 + fVar24 * fVar23 + fVar18 * fVar20;
        fVar21 = (fVar23 * fVar11 + fVar23 * fVar28) - fVar23 * fVar29;
        fVar12 = (fVar11 * fVar18 + fVar28 * fVar18) - fVar29 * fVar18;
        fVar14 = (fVar11 * fVar30 + fVar28 * fVar30) - fVar29 * fVar30;
        fVar22 = fVar15 * fVar21 + (fVar22 - fVar23 * fVar28);
        fVar27 = (fVar20 - fVar29 * fVar18) - fVar16 * fVar12;
        fVar26 = (fVar26 - fVar29 * fVar30) - fVar16 * fVar14;
        fVar20 = (fVar24 - fVar23 * fVar29) - fVar21 * fVar16;
        fVar11 = fVar12 * fVar15 + (fVar19 - fVar28 * fVar18);
        fVar14 = fVar14 * fVar15 + (fVar25 - fVar28 * fVar30);
        fVar12 = fVar11 * fVar30 - fVar14 * fVar18;
        fVar14 = fVar14 * fVar23 - fVar22 * fVar30;
        fVar11 = fVar22 * fVar18 - fVar23 * fVar11;
        fVar19 = fVar30 * fVar27 - fVar26 * fVar18;
        fVar30 = fVar23 * fVar26 - fVar20 * fVar30;
        fVar23 = fVar20 * fVar18 - fVar27 * fVar23;
        local_40._4_4_ = fVar30;
        local_40._0_4_ = fVar19;
        local_40._8_4_ = fVar23;
        local_40._12_4_ = 0;
        if ((rotAllowed == 0) && (this->m_hasStaticBody != false)) {
          fVar12 = fVar12 * fVar15;
          fVar14 = fVar14 * fVar15;
          fVar11 = fVar15 * fVar11;
          local_40._4_4_ = fVar16 * fVar30;
          local_40._0_4_ = fVar16 * fVar19;
          local_40._8_4_ = fVar16 * fVar23;
          local_40._12_4_ = 0;
        }
        pbVar5 = info->m_J1angularAxis;
        *(ulong *)(pbVar5 + lVar9) = CONCAT44(fVar14,fVar12);
        pbVar5[lVar9 + 2] = fVar11;
        pbVar5 = info->m_J2angularAxis;
        lVar7 = 0;
        do {
          pbVar5[lVar9 + lVar7] = -*(btScalar *)(local_40 + lVar7 * 4);
          lVar7 = lVar7 + 1;
        } while (lVar7 != 3);
      }
      else {
        fVar15 = (this->m_calculatedTransformB).m_origin.m_floats[0] -
                 (transA->m_origin).m_floats[0];
        fVar23 = ax1->m_floats[0];
        pbVar5 = info->m_J1angularAxis;
        uVar1 = *(undefined8 *)((this->m_calculatedTransformB).m_origin.m_floats + 1);
        uVar2 = *(undefined8 *)((transA->m_origin).m_floats + 1);
        fVar16 = (float)uVar1 - (float)uVar2;
        fVar11 = (float)((ulong)uVar1 >> 0x20) - (float)((ulong)uVar2 >> 0x20);
        fVar12 = (float)*(undefined8 *)(ax1->m_floats + 1);
        fVar14 = (float)((ulong)*(undefined8 *)(ax1->m_floats + 1) >> 0x20);
        *(ulong *)(pbVar5 + lVar9) =
             CONCAT44(fVar23 * fVar11 - fVar15 * fVar14,fVar14 * fVar16 - fVar11 * fVar12);
        pbVar5[lVar9 + 2] = fVar15 * fVar12 - fVar16 * fVar23;
        fVar15 = (this->m_calculatedTransformB).m_origin.m_floats[0] -
                 (transB->m_origin).m_floats[0];
        fVar23 = ax1->m_floats[0];
        pbVar5 = info->m_J2angularAxis;
        uVar1 = *(undefined8 *)((this->m_calculatedTransformB).m_origin.m_floats + 1);
        uVar2 = *(undefined8 *)((transB->m_origin).m_floats + 1);
        fVar16 = (float)uVar1 - (float)uVar2;
        fVar11 = (float)((ulong)uVar1 >> 0x20) - (float)((ulong)uVar2 >> 0x20);
        fVar12 = (float)*(undefined8 *)(ax1->m_floats + 1);
        fVar14 = (float)((ulong)*(undefined8 *)(ax1->m_floats + 1) >> 0x20);
        *(ulong *)(pbVar5 + lVar9) =
             CONCAT44(fVar23 * fVar11 - fVar15 * fVar14,fVar14 * fVar16 - fVar11 * fVar12) ^
             0x8000000080000000;
        pbVar5[lVar9 + 2] = -(fVar15 * fVar12 - fVar16 * fVar23);
      }
    }
    if (iVar4 == 0) {
      info->m_constraintError[lVar9] = 0.0;
      iVar8 = 1;
      if (bVar3 != false) {
        info->cfm[lVar9] = limot->m_normalCFM;
        bVar13 = limot->m_targetVelocity;
        if (rotational == 0) {
          bVar13 = -bVar13;
        }
        bVar13 = btTypedConstraint::getMotorFactor
                           (&this->super_btTypedConstraint,limot->m_currentPosition,limot->m_loLimit
                            ,limot->m_hiLimit,bVar13,info->fps * limot->m_stopERP);
        info->m_constraintError[lVar9] =
             bVar13 * limot->m_targetVelocity + info->m_constraintError[lVar9];
        info->m_lowerLimit[lVar9] = -limot->m_maxMotorForce;
        info->m_upperLimit[lVar9] = limot->m_maxMotorForce;
      }
    }
    else {
      fVar23 = limot->m_loLimit;
      fVar15 = limot->m_hiLimit;
      pbVar5 = info->m_constraintError;
      pbVar5[lVar9] = 0.0;
      if (bVar3 != false && fVar23 != fVar15) {
        info->cfm[lVar9] = limot->m_normalCFM;
      }
      fVar23 = info->fps * limot->m_stopERP;
      if (rotational != 0) {
        fVar23 = -fVar23;
      }
      pbVar5[lVar9] = fVar23 * limot->m_currentLimitError + pbVar5[lVar9];
      info->cfm[lVar9] = limot->m_stopCFM;
      if ((limot->m_loLimit != limot->m_hiLimit) || (NAN(limot->m_loLimit) || NAN(limot->m_hiLimit))
         ) {
        bVar13 = 0.0;
        if (iVar4 != 1) {
          bVar13 = -3.4028235e+38;
        }
        if (iVar4 == 1) {
          bVar17 = 3.4028235e+38;
        }
        else {
          bVar17 = 0.0;
        }
        info->m_lowerLimit[lVar9] = bVar13;
        info->m_upperLimit[lVar9] = bVar17;
        fVar23 = limot->m_bounce;
        iVar8 = 1;
        if (0.0 < fVar23) {
          if (rotational != 0) {
            linVelB = angVelB;
            linVelA = angVelA;
          }
          fVar15 = (linVelA->m_floats[2] * ax1->m_floats[2] +
                   linVelA->m_floats[0] * ax1->m_floats[0] + linVelA->m_floats[1] * ax1->m_floats[1]
                   ) - (ax1->m_floats[2] * linVelB->m_floats[2] +
                       ax1->m_floats[0] * linVelB->m_floats[0] +
                       ax1->m_floats[1] * linVelB->m_floats[1]);
          if (iVar4 == 1) {
            if (0.0 <= fVar15) {
              return 1;
            }
            fVar15 = fVar15 * -fVar23;
            if (fVar15 < pbVar5[lVar9] || fVar15 == pbVar5[lVar9]) {
              return 1;
            }
          }
          else {
            if (fVar15 <= 0.0) {
              return 1;
            }
            fVar15 = fVar15 * -fVar23;
            if (pbVar5[lVar9] <= fVar15) {
              return 1;
            }
          }
          pbVar5[lVar9] = fVar15;
        }
      }
      else {
        info->m_lowerLimit[lVar9] = -3.4028235e+38;
        info->m_upperLimit[lVar9] = 3.4028235e+38;
        iVar8 = 1;
      }
    }
  }
  return iVar8;
}

Assistant:

int btGeneric6DofConstraint::get_limit_motor_info2(
	btRotationalLimitMotor * limot,
	const btTransform& transA,const btTransform& transB,const btVector3& linVelA,const btVector3& linVelB,const btVector3& angVelA,const btVector3& angVelB,
	btConstraintInfo2 *info, int row, btVector3& ax1, int rotational,int rotAllowed)
{
    int srow = row * info->rowskip;
    int powered = limot->m_enableMotor;
    int limit = limot->m_currentLimit;
    if (powered || limit)
    {   // if the joint is powered, or has joint limits, add in the extra row
        btScalar *J1 = rotational ? info->m_J1angularAxis : info->m_J1linearAxis;
        btScalar *J2 = rotational ? info->m_J2angularAxis : info->m_J2linearAxis;
        J1[srow+0] = ax1[0];
        J1[srow+1] = ax1[1];
        J1[srow+2] = ax1[2];

        J2[srow+0] = -ax1[0];
        J2[srow+1] = -ax1[1];
        J2[srow+2] = -ax1[2];

		if((!rotational))
        {
			if (m_useOffsetForConstraintFrame)
			{
				btVector3 tmpA, tmpB, relA, relB;
				// get vector from bodyB to frameB in WCS
				relB = m_calculatedTransformB.getOrigin() - transB.getOrigin();
				// get its projection to constraint axis
				btVector3 projB = ax1 * relB.dot(ax1);
				// get vector directed from bodyB to constraint axis (and orthogonal to it)
				btVector3 orthoB = relB - projB;
				// same for bodyA
				relA = m_calculatedTransformA.getOrigin() - transA.getOrigin();
				btVector3 projA = ax1 * relA.dot(ax1);
				btVector3 orthoA = relA - projA;
				// get desired offset between frames A and B along constraint axis
				btScalar desiredOffs = limot->m_currentPosition - limot->m_currentLimitError;
				// desired vector from projection of center of bodyA to projection of center of bodyB to constraint axis
				btVector3 totalDist = projA + ax1 * desiredOffs - projB;
				// get offset vectors relA and relB
				relA = orthoA + totalDist * m_factA;
				relB = orthoB - totalDist * m_factB;
				tmpA = relA.cross(ax1);
				tmpB = relB.cross(ax1);
				if(m_hasStaticBody && (!rotAllowed))
				{
					tmpA *= m_factA;
					tmpB *= m_factB;
				}
				int i;
				for (i=0; i<3; i++) info->m_J1angularAxis[srow+i] = tmpA[i];
				for (i=0; i<3; i++) info->m_J2angularAxis[srow+i] = -tmpB[i];
			} else
			{
				btVector3 ltd;	// Linear Torque Decoupling vector
				btVector3 c = m_calculatedTransformB.getOrigin() - transA.getOrigin();
				ltd = c.cross(ax1);
				info->m_J1angularAxis[srow+0] = ltd[0];
				info->m_J1angularAxis[srow+1] = ltd[1];
				info->m_J1angularAxis[srow+2] = ltd[2];

				c = m_calculatedTransformB.getOrigin() - transB.getOrigin();
				ltd = -c.cross(ax1);
				info->m_J2angularAxis[srow+0] = ltd[0];
				info->m_J2angularAxis[srow+1] = ltd[1];
				info->m_J2angularAxis[srow+2] = ltd[2];
			}
        }
        // if we're limited low and high simultaneously, the joint motor is
        // ineffective
        if (limit && (limot->m_loLimit == limot->m_hiLimit)) powered = 0;
        info->m_constraintError[srow] = btScalar(0.f);
        if (powered)
        {
			info->cfm[srow] = limot->m_normalCFM;
            if(!limit)
            {
				btScalar tag_vel = rotational ? limot->m_targetVelocity : -limot->m_targetVelocity;

				btScalar mot_fact = getMotorFactor(	limot->m_currentPosition, 
													limot->m_loLimit,
													limot->m_hiLimit, 
													tag_vel, 
													info->fps * limot->m_stopERP);
				info->m_constraintError[srow] += mot_fact * limot->m_targetVelocity;
                info->m_lowerLimit[srow] = -limot->m_maxMotorForce;
                info->m_upperLimit[srow] = limot->m_maxMotorForce;
            }
        }
        if(limit)
        {
            btScalar k = info->fps * limot->m_stopERP;
			if(!rotational)
			{
				info->m_constraintError[srow] += k * limot->m_currentLimitError;
			}
			else
			{
				info->m_constraintError[srow] += -k * limot->m_currentLimitError;
			}
			info->cfm[srow] = limot->m_stopCFM;
            if (limot->m_loLimit == limot->m_hiLimit)
            {   // limited low and high simultaneously
                info->m_lowerLimit[srow] = -SIMD_INFINITY;
                info->m_upperLimit[srow] = SIMD_INFINITY;
            }
            else
            {
                if (limit == 1)
                {
                    info->m_lowerLimit[srow] = 0;
                    info->m_upperLimit[srow] = SIMD_INFINITY;
                }
                else
                {
                    info->m_lowerLimit[srow] = -SIMD_INFINITY;
                    info->m_upperLimit[srow] = 0;
                }
                // deal with bounce
                if (limot->m_bounce > 0)
                {
                    // calculate joint velocity
                    btScalar vel;
                    if (rotational)
                    {
                        vel = angVelA.dot(ax1);
//make sure that if no body -> angVelB == zero vec
//                        if (body1)
                            vel -= angVelB.dot(ax1);
                    }
                    else
                    {
                        vel = linVelA.dot(ax1);
//make sure that if no body -> angVelB == zero vec
//                        if (body1)
                            vel -= linVelB.dot(ax1);
                    }
                    // only apply bounce if the velocity is incoming, and if the
                    // resulting c[] exceeds what we already have.
                    if (limit == 1)
                    {
                        if (vel < 0)
                        {
                            btScalar newc = -limot->m_bounce* vel;
                            if (newc > info->m_constraintError[srow]) 
								info->m_constraintError[srow] = newc;
                        }
                    }
                    else
                    {
                        if (vel > 0)
                        {
                            btScalar newc = -limot->m_bounce * vel;
                            if (newc < info->m_constraintError[srow]) 
								info->m_constraintError[srow] = newc;
                        }
                    }
                }
            }
        }
        return 1;
    }
    else return 0;
}